

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderIncompleteGSTest::initTestRuns(GeometryShaderIncompleteGSTest *this)

{
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  *this_00;
  _run local_2f;
  _run local_2c;
  _run local_29;
  _run local_26;
  _run local_23;
  
  local_23.is_input_primitive_type_defined = false;
  local_23.is_max_vertices_defined = false;
  this_00 = &this->m_test_runs;
  local_23.is_output_primitive_type_defined = false;
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::emplace_back<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,&local_23);
  local_26.is_input_primitive_type_defined = false;
  local_26.is_max_vertices_defined = false;
  local_26.is_output_primitive_type_defined = true;
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::emplace_back<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,&local_26);
  local_29.is_input_primitive_type_defined = false;
  local_29.is_max_vertices_defined = true;
  local_29.is_output_primitive_type_defined = false;
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::emplace_back<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,&local_29);
  local_2c.is_input_primitive_type_defined = true;
  local_2c.is_max_vertices_defined = true;
  local_2c.is_output_primitive_type_defined = false;
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::emplace_back<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,&local_2c);
  local_2f.is_input_primitive_type_defined = false;
  local_2f.is_max_vertices_defined = true;
  local_2f.is_output_primitive_type_defined = true;
  std::
  vector<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
  ::emplace_back<glcts::GeometryShaderIncompleteGSTest::_run>(this_00,&local_2f);
  return;
}

Assistant:

void GeometryShaderIncompleteGSTest::initTestRuns()
{
	/*                         input_primitive_defined | max_vertices_defined | output_primitive_defined
	 *                         ------------------------|----------------------|-------------------------*/
	m_test_runs.push_back(_run(false, false, false));
	m_test_runs.push_back(_run(false, false, true));
	m_test_runs.push_back(_run(false, true, false));
	m_test_runs.push_back(_run(true, true, false));
	m_test_runs.push_back(_run(false, true, true));
}